

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

char * utf8_decode(char *o,int *val)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  int count;
  ulong uVar10;
  
  bVar4 = *o;
  uVar8 = (uint)bVar4;
  uVar7 = (uint)bVar4;
  if ((char)bVar4 < '\0') {
    puVar9 = utf8_decode::limits;
    bVar4 = 0;
    uVar10 = 0;
    uVar3 = 0;
    do {
      uVar7 = uVar3;
      if ((uVar8 & 0x40) == 0) {
        uVar7 = uVar7 | (uVar8 & 0x3f) << (bVar4 & 0x1f);
        bVar1 = false;
        if ((uVar10 < 4) && (uVar7 < 0x110000)) {
          bVar1 = *puVar9 < uVar7;
          uVar5 = 0;
          if (*puVar9 < uVar7) {
            uVar5 = uVar10;
          }
          o = o + uVar5;
        }
        goto LAB_001221d2;
      }
      lVar2 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      bVar6 = o[lVar2] & 0xc0;
      uVar8 = uVar8 << (bVar6 == 0x80);
      puVar9 = puVar9 + 1;
      bVar4 = bVar4 + 5;
      uVar3 = (byte)o[lVar2] & 0x3f | uVar7 << 6;
    } while (bVar6 == 0x80);
    bVar1 = false;
LAB_001221d2:
    if (!bVar1) {
      return (char *)0x0;
    }
  }
  if (val != (int *)0x0) {
    *val = uVar7;
  }
  return o + 1;
}

Assistant:

static const char *utf8_decode (const char *o, int *val) {
  static const unsigned int limits[] = {0xFF, 0x7F, 0x7FF, 0xFFFF};
  const unsigned char *s = (const unsigned char *)o;
  unsigned int c = s[0];
  unsigned int res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    while (c & 0x40) {  /* still have continuation bytes? */
      int cc = s[++count];  /* read next byte */
      if ((cc & 0xC0) != 0x80)  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
      c <<= 1;  /* to test next bit */
    }
    res |= ((c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 3 || res > MAXUNICODE || res <= limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (val) *val = res;
  return (const char *)s + 1;  /* +1 to include first byte */
}